

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_job * ma_job_init(ma_uint16 code)

{
  ma_job *in_RDI;
  
  (in_RDI->toc).allocation = 0;
  in_RDI->next = 0;
  *(undefined8 *)((long)&in_RDI->data + 0x38) = 0;
  *(undefined8 *)((long)&in_RDI->data + 0x40) = 0;
  *(undefined8 *)((long)&in_RDI->data + 0x28) = 0;
  *(undefined8 *)((long)&in_RDI->data + 0x30) = 0;
  *(undefined8 *)((long)&in_RDI->data + 0x18) = 0;
  *(undefined8 *)((long)&in_RDI->data + 0x20) = 0;
  (in_RDI->data).custom.data0 = 0;
  (in_RDI->data).custom.data1 = 0;
  *(undefined8 *)&in_RDI->order = 0;
  (in_RDI->data).custom.proc = (ma_job_proc)0x0;
  *(undefined8 *)((long)&in_RDI->data + 0x48) = 0;
  (in_RDI->toc).breakup.code = code;
  (in_RDI->toc).breakup.slot = 0xffff;
  in_RDI->next = 0xffffffffffffffff;
  return in_RDI;
}

Assistant:

MA_API ma_job ma_job_init(ma_uint16 code)
{
    ma_job job;

    MA_ZERO_OBJECT(&job);
    job.toc.breakup.code = code;
    job.toc.breakup.slot = MA_JOB_SLOT_NONE;    /* Temp value. Will be allocated when posted to a queue. */
    job.next             = MA_JOB_ID_NONE;

    return job;
}